

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool copy_accessed_types(DatabaseInterface *input_db,DatabaseInterface *output_db,
                        vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *accessed,ResourceTag tag,uint *per_tag_written)

{
  _Hash_node_base _Var1;
  pointer puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  int iVar4;
  __node_base *p_Var5;
  size_t compressed_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  DatabaseInterface *local_40;
  DatabaseInterface *local_38;
  
  per_tag_written[tag] = (uint)(accessed->_M_h)._M_element_count;
  p_Var5 = &(accessed->_M_h)._M_before_begin;
  local_48 = state_json;
  local_40 = output_db;
  local_38 = input_db;
  while( true ) {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) break;
    _Var1._M_nxt = p_Var5[1]._M_nxt;
    compressed_size = 0;
    iVar4 = (*input_db->_vptr_DatabaseInterface[3])(input_db,tag,_Var1._M_nxt,&compressed_size,0,1);
    pvVar3 = local_48;
    if ((char)iVar4 == '\0') {
      if (tag != RESOURCE_SHADER_MODULE) break;
      fprintf(_stderr,
              "Fossilize ERROR: Reference shader module %016lx does not exist in database.\n",
              _Var1._M_nxt);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_48,compressed_size);
      input_db = local_38;
      iVar4 = (*local_38->_vptr_DatabaseInterface[3])
                        (local_38,tag,_Var1._M_nxt,&compressed_size,
                         (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start,1);
      if (((char)iVar4 == '\0') ||
         (puVar2 = (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start,
         iVar4 = (*local_40->_vptr_DatabaseInterface[4])
                           (local_40,tag,_Var1._M_nxt,puVar2,
                            (long)(local_48->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2,1),
         (char)iVar4 == '\0')) break;
    }
  }
  return p_Var5 == (__node_base *)0x0;
}

Assistant:

static bool copy_accessed_types(DatabaseInterface &input_db,
                                DatabaseInterface &output_db,
                                vector<uint8_t> &state_json,
                                const unordered_set<Hash> &accessed,
                                ResourceTag tag,
                                unsigned *per_tag_written)
{
	per_tag_written[tag] = accessed.size();
	for (auto hash : accessed)
	{
		size_t compressed_size = 0;
		if (!input_db.read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
		{
			if (tag == RESOURCE_SHADER_MODULE)
			{
				// We did not resolve shader module references, so we might hit an error here, but that's fine.
				LOGE("Reference shader module %016" PRIx64 " does not exist in database.\n", hash);
				continue;
			}
			else
				return false;
		}

		state_json.resize(compressed_size);

		if (!input_db.read_entry(tag, hash, &compressed_size, state_json.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			return false;
		if (!output_db.write_entry(tag, hash, state_json.data(), state_json.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
			return false;
	}
	return true;
}